

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_set_register.cpp
# Opt level: O1

void __thiscall
bidfx_public_api::price::pixie::SubjectSetRegister::AddSubscriptionControls
          (SubjectSetRegister *this,SubscriptionSync *subscription_sync)

{
  int iVar1;
  pointer pSVar2;
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  *pvVar3;
  iterator iVar4;
  ControlOperationEnum control_operation;
  uint32_t sid;
  map<bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState,_std::less<bidfx_public_api::price::subject::Subject>,_std::allocator<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>_>
  *this_00;
  Subject *subject;
  pointer __k;
  pair<std::_Rb_tree_iterator<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>,_std::_Rb_tree_iterator<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>_>
  pVar5;
  
  pvVar3 = SubscriptionSync::GetSubjects(subscription_sync);
  __k = (pvVar3->
        super__Vector_base<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
        )._M_impl.super__Vector_impl_data._M_start;
  pSVar2 = (pvVar3->
           super__Vector_base<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (__k != pSVar2) {
    this_00 = &this->subject_state_;
    sid = 0;
    do {
      iVar4 = std::
              _Rb_tree<bidfx_public_api::price::subject::Subject,_std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>,_std::_Select1st<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>,_std::less<bidfx_public_api::price::subject::Subject>,_std::allocator<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>_>
              ::find(&this_00->_M_t,__k);
      iVar1 = *(int *)&iVar4._M_node[1]._M_right;
      if (iVar1 == 4) {
        control_operation = TOGGLE;
LAB_001ad0bb:
        SubscriptionSync::AddControl(subscription_sync,sid,control_operation);
      }
      else {
        if (iVar1 == 3) {
          control_operation = REFRESH;
          goto LAB_001ad0bb;
        }
        if (iVar1 == 0) {
          pVar5 = std::
                  _Rb_tree<bidfx_public_api::price::subject::Subject,_std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>,_std::_Select1st<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>,_std::less<bidfx_public_api::price::subject::Subject>,_std::allocator<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>_>
                  ::equal_range(&this_00->_M_t,__k);
          std::
          _Rb_tree<bidfx_public_api::price::subject::Subject,_std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>,_std::_Select1st<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>,_std::less<bidfx_public_api::price::subject::Subject>,_std::allocator<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>_>
          ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar5.first._M_node,
                         (_Base_ptr)pVar5.second._M_node);
        }
      }
      *(undefined4 *)&iVar4._M_node[1]._M_right = 2;
      sid = sid + 1;
      __k = __k + 1;
    } while (__k != pSVar2);
  }
  return;
}

Assistant:

void SubjectSetRegister::AddSubscriptionControls(SubscriptionSync& subscription_sync)
{
    uint32_t sid = 0;

    for (const Subject& subject : subscription_sync.GetSubjects())
    {
        SubjectState& state = subject_state_.find(subject)->second;
        if (state.GetState() == STATE_UNSUBSCRIBED)
        {
            ClearSubjectState(subject);
        }
        else if (state.GetState() == STATE_REFRESH)
        {
            subscription_sync.AddControl(sid, ControlOperationEnum::REFRESH);
        }
        else if (state.GetState() == STATE_TOGGLE)
        {
            subscription_sync.AddControl(sid, ControlOperationEnum::TOGGLE);
        }
        state.SetState(STATE_SUBSCRIBED);
        sid ++;
    }
}